

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerbase.cpp
# Opt level: O1

void __thiscall PlayerBase::PlayerBase(PlayerBase *this)

{
  this->_vptr_PlayerBase = (_func_int **)&PTR__PlayerBase_0018ead0;
  this->_outSmplRate = 0;
  this->_eventCbFunc = (PLAYER_EVENT_CB)0x0;
  this->_eventCbParam = (void *)0x0;
  this->_fileReqCbFunc = (PLAYER_FILEREQ_CB)0x0;
  this->_fileReqCbParam = (void *)0x0;
  this->_logCbFunc = (PLAYER_LOG_CB)0x0;
  this->_logCbParam = (void *)0x0;
  return;
}

Assistant:

PlayerBase::PlayerBase() :
	_outSmplRate(0),
	_eventCbFunc(NULL),
	_eventCbParam(NULL),
	_fileReqCbFunc(NULL),
	_fileReqCbParam(NULL),
	_logCbFunc(NULL),
	_logCbParam(NULL)
{
}